

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::csv_reporter::do_suite_complete(csv_reporter *this)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *this_00;
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  __node_base *p_Var4;
  __node_base *p_Var5;
  int i;
  long lVar6;
  string local_50;
  
  if (this->verbose == true) {
    std::operator<<((ostream *)&std::cout,"\ngenerating CSV report\n");
  }
  this_00 = &(this->super_reporter).os;
  pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) =
       *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(undefined8 *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 8) = 0xf;
  p_Var4 = &(this->data)._M_h._M_before_begin;
  bVar1 = true;
  p_Var5 = p_Var4;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    if (!bVar1) {
      pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                         (this_00);
      std::operator<<(pbVar2,",");
    }
    pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    poVar3 = std::operator<<(pbVar2,"\"");
    escape(&local_50,(string *)(p_Var5 + 1));
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,"\"");
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = false;
  }
  pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar2,"\n");
  for (lVar6 = 0; lVar6 < this->n_samples; lVar6 = lVar6 + 1) {
    bVar1 = true;
    p_Var5 = p_Var4;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      if (!bVar1) {
        pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                           (this_00);
        std::operator<<(pbVar2,",");
      }
      std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00);
      std::ostream::_M_insert<double>((double)p_Var5[5]._M_nxt[lVar6]._M_nxt);
      bVar1 = false;
    }
    pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    std::operator<<(pbVar2,"\n");
  }
  if (this->verbose != false) {
    std::operator<<((ostream *)&std::cout,"done\n");
  }
  return;
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating CSV report\n";
            report_stream() << std::fixed;
            report_stream().precision(std::numeric_limits<double>::digits10);
            bool first = true;
            for(auto&& kv : data) {
                if(!first) report_stream() << ",";
                report_stream() << "\"" << escape(kv.first) << "\""; // TODO escape
                first = false;
            }
            report_stream() << "\n";
            for(int i = 0; i < n_samples; ++i) {
                first = true;
                for(auto&& kv : data) {
                    if(!first) report_stream() << ",";
                    report_stream() << kv.second[i].count();
                    first = false;
                }
                report_stream() << "\n";
            }
            if(verbose) progress_stream() << "done\n";
        }